

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O2

void __thiscall ZAP::Archive::Archive(Archive *this,char *data,size_t size)

{
  (this->header).magic = 0;
  (this->header).version = '\0';
  (this->header).compression = '\0';
  this->stream = (istream *)0x0;
  (this->lookupTable)._M_h._M_buckets = &(this->lookupTable)._M_h._M_single_bucket;
  (this->lookupTable)._M_h._M_bucket_count = 1;
  (this->lookupTable)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->lookupTable)._M_h._M_element_count = 0;
  (this->lookupTable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->lookupTable)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->lookupTable)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  openMemory(this,data,size);
  return;
}

Assistant:

bool Archive::getRawData(const std::string &virtual_path, char *&data, std::size_t &size) const
	{
		return getRawData(getEntry(virtual_path), data, size);
	}